

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O0

void __thiscall
Js::WebAssemblySharedArrayBuffer::FreeBuffer
          (WebAssemblySharedArrayBuffer *this,BYTE *buffer,uint32 length,uint32 maxLength)

{
  code *pcVar1;
  bool bVar2;
  ulong uVar3;
  undefined4 *puVar4;
  Type *this_00;
  JavascriptLibrary *this_01;
  Recycler *this_02;
  Recycler *recycler;
  uint32 additionalSize;
  uint32 maxLength_local;
  uint32 length_local;
  BYTE *buffer_local;
  WebAssemblySharedArrayBuffer *this_local;
  
  uVar3 = (**(code **)((long)(this->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.
                             super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject + 0x398))
                    (this,length);
  if ((uVar3 & 1) == 0) {
    Memory::DeleteArray<Memory::HeapAllocator,unsigned_char>
              (&Memory::HeapAllocator::Instance,(ulong)maxLength,buffer);
    if (maxLength < length) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                  ,0x286,"(maxLength >= length)","maxLength >= length");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if (maxLength - length != 0) {
      this_00 = RecyclableObject::GetType((RecyclableObject *)this);
      this_01 = Js::Type::GetLibrary(this_00);
      this_02 = JavascriptLibrary::GetRecycler(this_01);
      Memory::Recycler::ReportExternalMemoryFree(this_02,(ulong)(maxLength - length));
    }
  }
  else {
    ArrayBufferBase::FreeMemAlloc(buffer);
  }
  return;
}

Assistant:

void WebAssemblySharedArrayBuffer::FreeBuffer(BYTE* buffer, uint32 length, uint32 maxLength)
    {
        if (IsValidVirtualBufferLength(length))
        {
            FreeMemAlloc(buffer);
        }
        else
        {
            HeapDeleteArray(maxLength, buffer);

            AssertOrFailFast(maxLength >= length);
            // JavascriptSharedArrayBuffer::Finalize will only report freeing `length`, we have to take care of the balance
            uint32 additionalSize = maxLength - length;
            if (additionalSize > 0)
            {
                Recycler* recycler = GetType()->GetLibrary()->GetRecycler();
                recycler->ReportExternalMemoryFree(additionalSize);
            }
        }
    }